

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O1

ResultPointsAndTransitions *
ZXing::DataMatrix::TransitionsBetween
          (ResultPointsAndTransitions *__return_storage_ptr__,BitMatrix *image,ResultPoint *from,
          ResultPoint *to)

{
  bool bVar1;
  uint uVar2;
  int x_00;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int y_00;
  int x;
  int iVar10;
  int iVar11;
  int iVar12;
  int y;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  iVar16 = (int)(to->super_PointF).x;
  iVar17 = (int)(from->super_PointF).x;
  iVar14 = (int)(to->super_PointF).y;
  iVar15 = (int)(from->super_PointF).y;
  uVar8 = iVar14 - iVar15;
  uVar2 = -uVar8;
  if (0 < (int)uVar8) {
    uVar2 = uVar8;
  }
  uVar9 = iVar16 - iVar17;
  uVar8 = -uVar9;
  if (0 < (int)uVar9) {
    uVar8 = uVar9;
  }
  iVar11 = iVar14;
  iVar10 = iVar17;
  iVar13 = iVar15;
  if (uVar8 < uVar2) {
    iVar11 = iVar16;
    iVar10 = iVar15;
    iVar13 = iVar17;
    iVar16 = iVar14;
  }
  uVar6 = iVar16 - iVar10;
  uVar9 = -uVar6;
  if (0 < (int)uVar6) {
    uVar9 = uVar6;
  }
  iVar7 = iVar11 - iVar13;
  bVar1 = iVar13 <= iVar11;
  iVar14 = -iVar7;
  if (0 < iVar7) {
    iVar14 = iVar7;
  }
  bVar3 = BitMatrix::get(image,iVar17,iVar15);
  iVar15 = 0;
  if (iVar16 != iVar10) {
    iVar17 = (uint)(iVar10 < iVar16) * 2 + -1;
    iVar12 = -(uVar9 >> 1);
    iVar15 = 0;
    do {
      y_00 = iVar13;
      x_00 = iVar10;
      if (uVar8 < uVar2) {
        y_00 = iVar10;
        x_00 = iVar13;
      }
      bVar4 = BitMatrix::get(image,x_00,y_00);
      bVar5 = bVar4 ^ bVar3;
      if (bVar5 != 0) {
        bVar3 = bVar4;
      }
      bVar4 = SCARRY4(iVar12,iVar14);
      iVar12 = iVar12 + iVar14;
      if (iVar12 == 0 || bVar4 != iVar12 < 0) {
LAB_00153473:
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (iVar13 != iVar11) {
          iVar13 = iVar13 + (uint)(iVar7 != 0 && bVar1) * 2 + -1;
          iVar12 = iVar12 - uVar9;
          goto LAB_00153473;
        }
      }
      iVar15 = iVar15 + (uint)bVar5;
    } while ((!bVar4) && (bVar4 = iVar16 - iVar17 != iVar10, iVar10 = iVar17 + iVar10, bVar4));
  }
  __return_storage_ptr__->from = from;
  __return_storage_ptr__->to = to;
  __return_storage_ptr__->transitions = iVar15;
  return __return_storage_ptr__;
}

Assistant:

static ResultPointsAndTransitions TransitionsBetween(const BitMatrix& image, const ResultPoint& from,
													 const ResultPoint& to)
{
	// See QR Code Detector, sizeOfBlackWhiteBlackRun()
	int fromX = static_cast<int>(from.x());
	int fromY = static_cast<int>(from.y());
	int toX = static_cast<int>(to.x());
	int toY = static_cast<int>(to.y());
	bool steep = std::abs(toY - fromY) > std::abs(toX - fromX);
	if (steep) {
		std::swap(fromX, fromY);
		std::swap(toX, toY);
	}

	int dx = std::abs(toX - fromX);
	int dy = std::abs(toY - fromY);
	int error = -dx / 2;
	int ystep = fromY < toY ? 1 : -1;
	int xstep = fromX < toX ? 1 : -1;
	int transitions = 0;
	bool inBlack = image.get(steep ? fromY : fromX, steep ? fromX : fromY);
	for (int x = fromX, y = fromY; x != toX; x += xstep) {
		bool isBlack = image.get(steep ? y : x, steep ? x : y);
		if (isBlack != inBlack) {
			transitions++;
			inBlack = isBlack;
		}
		error += dy;
		if (error > 0) {
			if (y == toY) {
				break;
			}
			y += ystep;
			error -= dx;
		}
	}
	return ResultPointsAndTransitions{ &from, &to, transitions };
}